

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim.c
# Opt level: O0

int Gia_ManBuiltInSimPack(Gia_Man_t *p,Vec_Int_t *vPat)

{
  int iVar1;
  int iVar2;
  word *pwVar3;
  int local_28;
  int iLit;
  int k;
  int i;
  Vec_Int_t *vPat_local;
  Gia_Man_t *p_local;
  
  iVar1 = Vec_IntSize(vPat);
  if (iVar1 < 1) {
    __assert_fail("Vec_IntSize(vPat) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSim.c"
                  ,0x3b5,"int Gia_ManBuiltInSimPack(Gia_Man_t *, Vec_Int_t *)");
  }
  iLit = 0;
  do {
    if (p->iPatsPi <= iLit) {
      return -1;
    }
    for (local_28 = 0; iVar1 = Vec_IntSize(vPat), local_28 < iVar1; local_28 = local_28 + 1) {
      iVar1 = Vec_IntEntry(vPat,local_28);
      iVar2 = Abc_Lit2Var(iVar1);
      pwVar3 = Gia_ManBuiltInDataPi(p,iVar2);
      iVar2 = Abc_TtGetBit(pwVar3,iLit);
      if (iVar2 != 0) {
        iVar2 = Abc_Lit2Var(iVar1);
        pwVar3 = Gia_ManBuiltInData(p,iVar2 + 1);
        iVar2 = Abc_TtGetBit(pwVar3,iLit);
        iVar1 = Abc_LitIsCompl(iVar1);
        if (iVar2 == iVar1) break;
      }
    }
    iVar1 = Vec_IntSize(vPat);
    if (local_28 == iVar1) {
      return iLit;
    }
    iLit = iLit + 1;
  } while( true );
}

Assistant:

int Gia_ManBuiltInSimPack( Gia_Man_t * p, Vec_Int_t * vPat )
{
    int i, k, iLit;
    assert( Vec_IntSize(vPat) > 0 );
    //printf( "%d ", Vec_IntSize(vPat) );
    for ( i = 0; i < p->iPatsPi; i++ )
    {
        Vec_IntForEachEntry( vPat, iLit, k )
            if ( Abc_TtGetBit(Gia_ManBuiltInDataPi(p, Abc_Lit2Var(iLit)), i) && 
                 Abc_TtGetBit(Gia_ManBuiltInData(p, 1+Abc_Lit2Var(iLit)), i) == Abc_LitIsCompl(iLit) )
                break;
        if ( k == Vec_IntSize(vPat) )
            return i; // success
    }
    return -1; // failure
}